

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::detail::testing::testUnitSequenceGeneration
                   (string *__return_storage_ptr__,double mul,string *test)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)test);
  generateUnitSequence(__return_storage_ptr__,mul,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string
            testUnitSequenceGeneration(double mul, const std::string& test)
        {
            return generateUnitSequence(mul, test);
        }